

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

int require_newline(IncludeState *state)

{
  Token TVar1;
  undefined1 local_15;
  Token token;
  IncludeState *state_local;
  
  TVar1 = lexer(state);
  pushback(state);
  local_15 = true;
  if ((TVar1 != TOKEN_INCOMPLETE_COMMENT) && (local_15 = true, TVar1 != 10)) {
    local_15 = TVar1 == TOKEN_EOI;
  }
  return (int)local_15;
}

Assistant:

static int require_newline(IncludeState *state)
{
    const Token token = lexer(state);
    pushback(state);  // rewind no matter what.
    return ( (token == TOKEN_INCOMPLETE_COMMENT) || // call it an eol.
             (token == ((Token) '\n')) || (token == TOKEN_EOI) );
}